

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  ExportModuleField *pEVar2;
  Enum EVar3;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_90;
  size_t local_88;
  char *pcStack_80;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_78;
  undefined8 uStack_70;
  Token local_68;
  
  RVar1 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    GetToken(&local_68,this);
    local_78.offset = (size_t)local_68.loc.field_1.field_1.offset;
    uStack_70 = local_68.loc.field_1._8_8_;
    local_88 = local_68.loc.filename._M_len;
    pcStack_80 = local_68.loc.filename._M_str;
    pEVar2 = (ExportModuleField *)operator_new(0xb0);
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
    super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__ModuleField_00242ba0;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename._M_len
         = local_88;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.filename._M_str
         = pcStack_80;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.field_1.field_1
    .offset = local_78.offset;
    *(undefined8 *)
     ((long)&(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.loc.
             field_1 + 8) = uStack_70;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.type_ = Export;
    (pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField._vptr_ModuleField =
         (_func_int **)&PTR__ExportModuleField_00242fe8;
    (pEVar2->export_).name._M_dataplus._M_p = (pointer)&(pEVar2->export_).name.field_2;
    (pEVar2->export_).name._M_string_length = 0;
    (pEVar2->export_).name.field_2._M_local_buf[0] = '\0';
    Var::Var(&(pEVar2->export_).var);
    RVar1 = Expect(this,Export);
    EVar3 = Error;
    if (RVar1.enum_ != Error) {
      EVar3 = Error;
      RVar1 = ParseQuotedText(this,&(pEVar2->export_).name,true);
      if (RVar1.enum_ != Error) {
        RVar1 = ParseExportDesc(this,&pEVar2->export_);
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_90._M_head_impl = pEVar2;
            Module::AppendField(module,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                                        *)&local_90);
            if (local_90._M_head_impl != (ExportModuleField *)0x0) {
              (*((local_90._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_90._M_head_impl = (ExportModuleField *)0x0;
            EVar3 = Ok;
            pEVar2 = (ExportModuleField *)0x0;
          }
        }
      }
    }
    if (pEVar2 != (ExportModuleField *)0x0) {
      (*(pEVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
        _vptr_ModuleField[1])(pEVar2);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}